

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O1

void __thiscall
helics::tcp::TcpCommsSS::loadNetworkInfo(TcpCommsSS *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
  if (bVar1) {
    this->reuse_address = netInfo->reuse_address;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->encryption_config,&netInfo->encryptionConfig);
    CommsInterface::propertyUnLock((CommsInterface *)this);
    return;
  }
  return;
}

Assistant:

void TcpCommsSS::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    reuse_address = netInfo.reuse_address;
    encryption_config = netInfo.encryptionConfig;
    propertyUnLock();
}